

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture2DView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ulong uVar6;
  bool bVar7;
  int i;
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int lodOffsNdx;
  int iVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  Texture2DView TVar25;
  Vec2 coordDxo;
  Vec2 lodBounds;
  Vec2 clampedLod;
  Vector<bool,_4> res_6;
  Vec2 coordDy;
  IVec2 srcSize;
  Vector<float,_4> res_4;
  Vec4 refPix;
  Vec4 resPix;
  Vec3 triW [2];
  Vec3 triT [2];
  Vec3 triS [2];
  Vector<float,_2> res_13;
  Vec2 lodBias;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Texture2DView src;
  Vec2 lodOffsets [4];
  undefined1 local_268 [24];
  float local_250 [4];
  float local_240 [2];
  float local_238 [2];
  undefined8 local_230;
  int local_224;
  float local_220;
  float local_21c;
  float local_218;
  float local_214;
  float local_210 [4];
  float local_200;
  float local_1fc;
  int local_1f8 [2];
  ulong local_1f0;
  undefined1 local_1e8 [36];
  float local_1c4;
  float local_1c0;
  float local_1bc;
  float local_1b8;
  float local_1b4;
  float local_1b0;
  float local_1ac;
  float local_1a8 [4];
  Vec4 local_198;
  float local_188 [8];
  float local_168 [8];
  float local_148 [8];
  PixelBufferAccess *local_128;
  float local_120 [2];
  undefined1 local_118 [16];
  float local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  Sampler *local_f8;
  ConstPixelBufferAccess *local_f0;
  ConstPixelBufferAccess *local_e8;
  float afStack_e0 [2];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_d8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  Texture2DView local_98;
  undefined1 local_88 [4];
  float fStack_84;
  ConstPixelBufferAccess *pCStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  
  local_d8.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar15 = sampleParams->baseLevel;
  iVar12 = baseView->m_numLevels + -1;
  iVar14 = iVar12;
  if (iVar15 < iVar12) {
    iVar14 = iVar15;
  }
  iVar13 = 0;
  if (iVar15 < 0) {
    iVar14 = 0;
  }
  iVar15 = sampleParams->maxLevel;
  if (iVar15 < iVar12) {
    iVar12 = iVar15;
  }
  iVar8 = 1;
  if (iVar14 <= iVar15) {
    iVar8 = (iVar12 - iVar14) + 1;
  }
  pCStack_80 = baseView->m_levels + iVar14;
  local_88 = (undefined1  [4])iVar8;
  local_f8 = &sampleParams->sampler;
  local_128 = errorMask;
  local_e8 = reference;
  TVar25 = tcu::getEffectiveTextureView((Texture2DView *)local_88,&local_d8,local_f8);
  local_98.m_levels = TVar25.m_levels;
  local_98.m_numLevels = TVar25.m_numLevels;
  if (0 < local_98.m_numLevels) {
    iVar13 = ((local_98.m_levels)->m_size).m_data[0];
  }
  local_148[0] = *texCoord;
  local_168[0] = texCoord[1];
  local_148[1] = texCoord[2];
  local_148[2] = texCoord[4];
  local_148[3] = texCoord[6];
  local_168[1] = texCoord[3];
  local_168[2] = texCoord[5];
  local_168[3] = texCoord[7];
  if (local_98.m_numLevels < 1) {
    local_1f8[1] = 0;
  }
  else {
    local_1f8[1] = ((local_98.m_levels)->m_size).m_data[1];
  }
  local_220 = (float)(result->m_size).m_data[0];
  local_250[3] = (float)(result->m_size).m_data[1];
  local_188[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_188[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_188[2] = (sampleParams->super_RenderParams).w.m_data[2];
  local_188[3] = (sampleParams->super_RenderParams).w.m_data[3];
  fVar16 = 0.0;
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    fVar16 = (sampleParams->super_RenderParams).bias;
  }
  lVar9 = 0;
  do {
    afStack_e0[lVar9] = fVar16;
    lVar9 = lVar9 + 1;
  } while (lVar9 == 1);
  local_88 = (undefined1  [4])0xbf800000;
  fStack_84 = 0.0;
  pCStack_80 = (ConstPixelBufferAccess *)0x3f800000;
  local_78 = 0xbf80000000000000;
  uStack_70 = 0x3f80000000000000;
  local_1a8[0] = -1.7146522e+38;
  local_1f8[0] = iVar13;
  local_188[4] = local_188[2];
  local_188[5] = local_188[1];
  local_168[4] = local_168[2];
  local_168[5] = local_168[1];
  local_148[4] = local_148[2];
  local_148[5] = local_148[1];
  tcu::RGBA::toVec((RGBA *)&local_198);
  tcu::clear(local_128,&local_198);
  if ((result->m_size).m_data[1] < 1) {
    local_1f0 = 0;
  }
  else {
    local_1f0 = 0;
    iVar15 = 0;
    local_f0 = result;
    do {
      if (watchDog != (qpWatchDog *)0x0) {
        qpWatchDog_touch(watchDog);
      }
      if (0 < (result->m_size).m_data[0]) {
        fVar16 = (float)iVar15 + 0.5;
        local_a8 = ZEXT416((uint)fVar16);
        local_68 = ZEXT416((uint)(local_250[3] - fVar16));
        local_b8 = ZEXT416((uint)(fVar16 / local_250[3]));
        local_1e8._28_4_ = 1.0 - fVar16 / local_250[3];
        iVar14 = 0;
        local_224 = iVar15;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_268,(int)result,iVar14,iVar15);
          local_1a8[0] = 0.0;
          local_1a8[1] = 0.0;
          local_1a8[2] = 0.0;
          local_1a8[3] = 0.0;
          lVar9 = 0;
          do {
            local_1a8[lVar9] =
                 *(float *)(local_268 + lVar9 * 4) -
                 (sampleParams->super_RenderParams).colorBias.m_data[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          local_198.m_data[0] = 0.0;
          local_198.m_data[1] = 0.0;
          local_198.m_data[2] = 0.0;
          local_198.m_data[3] = 0.0;
          lVar9 = 0;
          do {
            local_198.m_data[lVar9] =
                 local_1a8[lVar9] / (sampleParams->super_RenderParams).colorScale.m_data[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_1e8,(int)local_e8,iVar14,iVar15);
          local_268._0_4_ = R;
          local_268._4_4_ = SNORM_INT8;
          local_268._8_4_ = 0;
          local_268._12_4_ = 0;
          lVar9 = 0;
          do {
            *(float *)(local_268 + lVar9 * 4) =
                 *(float *)(local_1e8 + lVar9 * 4) -
                 (sampleParams->super_RenderParams).colorBias.m_data[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          local_1a8[0] = 0.0;
          local_1a8[1] = 0.0;
          local_1a8[2] = 0.0;
          local_1a8[3] = 0.0;
          lVar9 = 0;
          do {
            local_1a8[lVar9] =
                 *(float *)(local_268 + lVar9 * 4) /
                 (sampleParams->super_RenderParams).colorScale.m_data[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          local_1e8._0_4_ = R;
          local_1e8._4_4_ = SNORM_INT8;
          local_1e8._8_4_ = 0;
          local_1e8._12_4_ = 0;
          lVar9 = 0;
          do {
            *(float *)(local_1e8 + lVar9 * 4) = local_198.m_data[lVar9] - local_1a8[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          local_268._0_4_ = R;
          local_268._4_4_ = SNORM_INT8;
          local_268._8_4_ = 0;
          local_268._12_4_ = 0;
          lVar9 = 0;
          do {
            fVar16 = *(float *)(local_1e8 + lVar9 * 4);
            auVar18._0_4_ = -fVar16;
            auVar18._4_4_ = 0x80000000;
            auVar18._8_4_ = 0x80000000;
            auVar18._12_4_ = 0x80000000;
            if (auVar18._0_4_ <= fVar16) {
              auVar18._0_4_ = fVar16;
            }
            *(int *)(local_268 + lVar9 * 4) = auVar18._0_4_;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          local_230 = local_230 & 0xffffffff00000000;
          lVar9 = 0;
          do {
            *(bool *)((long)&local_230 + lVar9) =
                 *(float *)(local_268 + lVar9 * 4) <= (lookupPrec->colorThreshold).m_data[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          if ((char)local_230 == '\0') {
LAB_00a1b8a0:
            fVar22 = (float)iVar14 + 0.5;
            fVar17 = fVar22 / local_220;
            local_108 = (float)local_b8._0_4_ + fVar17;
            uStack_104 = local_b8._4_4_;
            uStack_100 = local_b8._8_4_;
            uStack_fc = local_b8._12_4_;
            fVar16 = (float)local_b8._0_4_;
            local_210[3] = fVar22;
            if (1.0 <= local_108) {
              fVar17 = 1.0 - fVar17;
              fVar16 = (float)local_1e8._28_4_;
              local_210[3] = local_220 - fVar22;
            }
            uVar6 = (ulong)(1.0 <= local_108);
            fVar19 = local_148[uVar6 * 3];
            fVar20 = local_148[uVar6 * 3 + 1];
            fVar21 = (1.0 - fVar17) - fVar16;
            fVar1 = local_188[uVar6 * 3];
            local_1fc = local_188[uVar6 * 3 + 1];
            fVar2 = local_148[uVar6 * 3 + 2];
            local_200 = local_188[uVar6 * 3 + 2];
            fVar24 = fVar17 / local_200 + fVar16 / local_1fc + fVar21 / fVar1;
            fVar3 = local_168[uVar6 * 3];
            fVar4 = local_168[uVar6 * 3 + 1];
            fVar5 = local_168[uVar6 * 3 + 2];
            local_1e8._4_4_ =
                 ((fVar17 * fVar5) / local_200 +
                 (fVar16 * fVar4) / local_1fc + (fVar21 * fVar3) / fVar1) / fVar24;
            local_1e8._0_4_ =
                 ((fVar17 * fVar2) / local_200 +
                 (fVar16 * fVar20) / local_1fc + (fVar21 * fVar19) / fVar1) / fVar24;
            local_214 = local_1fc * local_200;
            fVar24 = fVar16 + -1.0;
            local_1ac = local_200 * local_220;
            fVar23 = (local_220 * fVar24 + fVar22) * local_214 -
                     (local_1ac * fVar16 + fVar22 * local_1fc) * fVar1;
            local_1b0 = (fVar20 - fVar19) * local_200 + (fVar2 - fVar20) * fVar1;
            local_1b4 = (fVar19 - fVar2) * local_1fc;
            local_1b8 = (fVar4 - fVar3) * local_200 + (fVar5 - fVar4) * fVar1;
            local_1bc = (fVar3 - fVar5) * local_1fc;
            fVar22 = fVar1 * local_1fc * local_200;
            fVar21 = fVar22 * local_220;
            fVar23 = fVar23 * fVar23;
            local_48 = ZEXT416((uint)fVar21);
            local_268._4_4_ = ((fVar24 * local_1bc + fVar16 * local_1b8) * fVar21) / fVar23;
            local_268._0_4_ = ((local_1b4 * fVar24 + fVar16 * local_1b0) * fVar21) / fVar23;
            local_58 = -fVar1;
            local_210[0] = 0.0;
            local_210[1] = 0.0;
            lVar9 = 0;
            do {
              local_210[lVar9] = (float)local_1f8[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 == 1);
            local_230 = 0;
            lVar9 = 0;
            do {
              *(float *)((long)&local_230 + lVar9 * 4) =
                   *(float *)(local_268 + lVar9 * 4) * local_210[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 == 1);
            fVar16 = fVar17 + -1.0;
            local_1c0 = local_1fc * local_250[3];
            uStack_54 = 0x80000000;
            uStack_50 = 0x80000000;
            uStack_4c = 0x80000000;
            fVar21 = (local_250[3] * fVar16 + (float)local_a8._0_4_) * local_214 +
                     (local_1c0 * fVar17 + (float)local_a8._0_4_ * local_200) * local_58;
            local_1c4 = (fVar19 - fVar20) * local_200;
            local_218 = (fVar20 - fVar2) * fVar1 + (fVar2 - fVar19) * local_1fc;
            local_21c = (fVar4 - fVar5) * fVar1 + (fVar5 - fVar3) * local_1fc;
            local_1e8._32_4_ = (fVar3 - fVar4) * local_200;
            fVar22 = fVar22 * local_250[3];
            fVar21 = fVar21 * fVar21;
            local_118 = ZEXT416((uint)fVar22);
            local_268._4_4_ =
                 ((fVar16 * (float)local_1e8._32_4_ + fVar17 * local_21c) * fVar22) / fVar21;
            local_268._0_4_ = ((local_1c4 * fVar16 + fVar17 * local_218) * fVar22) / fVar21;
            local_240[0] = 0.0;
            local_240[1] = 0.0;
            lVar9 = 0;
            do {
              local_240[lVar9] = (float)local_1f8[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 == 1);
            local_210[0] = 0.0;
            local_210[1] = 0.0;
            lVar9 = 0;
            do {
              local_210[lVar9] = *(float *)(local_268 + lVar9 * 4) * local_240[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 == 1);
            tcu::computeLodBoundsFromDerivates
                      ((tcu *)local_240,(float)local_230,local_230._4_4_,local_210[0],local_210[1],
                       lodPrec);
            local_108 = (float)(~-(uint)(1.0 <= local_108) & local_a8._0_4_ |
                               -(uint)(1.0 <= local_108) & local_68._0_4_);
            uStack_104 = local_a8._4_4_;
            uStack_100 = local_a8._8_4_;
            uStack_fc = local_a8._12_4_;
            lVar9 = 0;
            do {
              fVar16 = *(float *)(local_88 + lVar9 * 8) + local_210[3];
              fVar17 = *(float *)(local_88 + lVar9 * 8 + 4) + local_108;
              fVar20 = fVar17 / local_250[3];
              fVar22 = fVar20 + -1.0;
              fVar19 = (local_220 * fVar22 + fVar16) * local_214 +
                       (local_1ac * fVar20 + local_1fc * fVar16) * local_58;
              fVar19 = fVar19 * fVar19;
              local_238[1] = ((fVar22 * local_1bc + fVar20 * local_1b8) * (float)local_48._0_4_) /
                             fVar19;
              local_238[0] = ((local_1b4 * fVar22 + local_1b0 * fVar20) * (float)local_48._0_4_) /
                             fVar19;
              local_250[0] = 0.0;
              local_250[1] = 0.0;
              lVar10 = 0;
              do {
                local_250[lVar10] = (float)local_1f8[lVar10];
                lVar10 = lVar10 + 1;
              } while (lVar10 == 1);
              local_268._0_4_ = R;
              local_268._4_4_ = SNORM_INT8;
              lVar10 = 0;
              do {
                *(float *)(local_268 + lVar10 * 4) = local_238[lVar10] * local_250[lVar10];
                lVar10 = lVar10 + 1;
              } while (lVar10 == 1);
              fVar16 = fVar16 / local_220;
              fVar22 = fVar16 + -1.0;
              fVar17 = (local_250[3] * fVar22 + fVar17) * local_214 +
                       (local_1c0 * fVar16 + fVar17 * local_200) * local_58;
              fVar17 = fVar17 * fVar17;
              local_250[0] = ((local_1c4 * fVar22 + local_218 * fVar16) * (float)local_118._0_4_) /
                             fVar17;
              local_250[1] = ((fVar22 * (float)local_1e8._32_4_ + fVar16 * local_21c) *
                             (float)local_118._0_4_) / fVar17;
              local_120[0] = 0.0;
              local_120[1] = 0.0;
              lVar10 = 0;
              do {
                *(float *)(local_118 + lVar10 * 4 + -8) = (float)local_1f8[lVar10];
                lVar10 = lVar10 + 1;
              } while (lVar10 == 1);
              local_238[0] = 0.0;
              local_238[1] = 0.0;
              lVar10 = 0;
              do {
                local_238[lVar10] = local_250[lVar10] * *(float *)(local_118 + lVar10 * 4 + -8);
                lVar10 = lVar10 + 1;
              } while (lVar10 == 1);
              tcu::computeLodBoundsFromDerivates
                        ((tcu *)local_250,(float)local_268._0_4_,(float)local_268._4_4_,local_238[0]
                         ,local_238[1],lodPrec);
              local_240[1] = (float)(~-(uint)(local_250[1] <= local_240[1]) & (uint)local_250[1] |
                                    (uint)local_240[1] & -(uint)(local_250[1] <= local_240[1]));
              local_240[0] = (float)(~-(uint)(local_240[0] <= local_250[0]) & (uint)local_250[0] |
                                    (uint)local_240[0] & -(uint)(local_240[0] <= local_250[0]));
              lVar9 = lVar9 + 1;
            } while (lVar9 != 4);
            local_268._0_4_ = R;
            local_268._4_4_ = SNORM_INT8;
            lVar9 = 0;
            do {
              *(float *)(local_268 + lVar9 * 4) = local_240[lVar9] + afStack_e0[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 == 1);
            local_250[0] = sampleParams->minLod;
            local_250[1] = sampleParams->maxLod;
            tcu::clampLodBounds((tcu *)local_238,(Vec2 *)local_268,(Vec2 *)local_250,lodPrec);
            bVar7 = tcu::isLookupResultValid
                              (&local_98,local_f8,lookupPrec,(Vec2 *)local_1e8,(Vec2 *)local_238,
                               &local_198);
            iVar15 = local_224;
            if (!bVar7) {
              local_250[0] = -1.7014636e+38;
              tcu::RGBA::toVec((RGBA *)local_268);
              tcu::PixelBufferAccess::setPixel(local_128,(Vec4 *)local_268,iVar14,local_224,0);
              local_1f0 = (ulong)((int)local_1f0 + 1);
              iVar15 = local_224;
            }
          }
          else {
            uVar6 = 0;
            do {
              uVar11 = uVar6;
              if (uVar11 == 3) break;
              uVar6 = uVar11 + 1;
            } while (*(char *)((long)&local_230 + uVar11 + 1) != '\0');
            if (uVar11 < 3) goto LAB_00a1b8a0;
          }
          iVar14 = iVar14 + 1;
          result = local_f0;
        } while (iVar14 < (local_f0->m_size).m_data[0]);
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 < (result->m_size).m_data[1]);
  }
  if (local_d8.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (int)local_1f0;
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::Texture2DView&				baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture2DView					src					= getEffectiveTextureView(getSubView(baseView, sampleParams.baseLevel, sampleParams.maxLevel), srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[2+0], texCoord[4+0], texCoord[6+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[2+1], texCoord[4+1], texCoord[6+1]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const tcu::IVec2							srcSize				= tcu::IVec2(src.getWidth(), src.getHeight());

	// Coordinates and lod per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec2	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy));
				const tcu::Vec2	coordDx		= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
														triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy)) * srcSize.asFloat();
				const tcu::Vec2	coordDy		= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
														triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx)) * srcSize.asFloat();

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx.x(), coordDx.y(), coordDy.x(), coordDy.y(), lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const tcu::Vec2	coordDxo	= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
															triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo)) * srcSize.asFloat();
					const tcu::Vec2	coordDyo	= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
															triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo)) * srcSize.asFloat();
					const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo.x(), coordDxo.y(), coordDyo.x(), coordDyo.y(), lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix);

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}